

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O1

void __thiscall
CoreML::NeuralNetworkShaper::shapeLoadConstantLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  LogMessage *pLVar1;
  mapped_type *this_00;
  LayerUnion from;
  LoadConstantLayerParams load_constant;
  LogFinisher local_171;
  LoadConstantLayerParams local_170;
  LogMessage local_138;
  LogMessage local_100;
  LogMessage local_c8;
  LogMessage local_90;
  LogMessage local_58;
  
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5c6);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_90,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_138,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5c6);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_58,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_138,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  ShapeConstraint::setName
            (this_00,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if (specLayer->_oneof_case_[0] == 0x122) {
    from = specLayer->layer_;
  }
  else {
    from.loadconstant_ = Specification::LoadConstantLayerParams::default_instance();
  }
  Specification::LoadConstantLayerParams::LoadConstantLayerParams(&local_170,from.loadconstant_);
  ShapeConstraint::setSequence(this_00,1);
  ShapeConstraint::setBatch(this_00,1);
  if (local_170.shape_.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_100,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x472);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_100,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_138,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_100);
  }
  ShapeConstraint::setChannel(this_00,(local_170.shape_.rep_)->elements[0]);
  if (local_170.shape_.current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_c8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x472);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_c8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_138,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_c8);
  }
  ShapeConstraint::setHeight(this_00,(size_t)local_170.shape_.rep_[1].arena);
  if (local_170.shape_.current_size_ < 3) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_138,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x472);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_138,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_171,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_138);
  }
  ShapeConstraint::setWidth(this_00,local_170.shape_.rep_[1].elements[0]);
  Specification::LoadConstantLayerParams::~LoadConstantLayerParams(&local_170);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeLoadConstantLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Load Constant layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    Specification::LoadConstantLayerParams load_constant = specLayer.loadconstant();

    outputShape.setSequence(1);
    outputShape.setBatch(1);
    outputShape.setChannel((size_t)load_constant.shape(0));
    outputShape.setHeight((size_t)load_constant.shape(1));
    outputShape.setWidth((size_t)load_constant.shape(2));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Load Constant layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}